

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O2

int lj_cf_debug_gethook(lua_State *L)

{
  TValue *pTVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined8 in_RAX;
  lua_Hook p_Var5;
  ulong uVar6;
  bool bVar7;
  undefined3 uStack_18;
  char buff [5];
  
  _uStack_18 = in_RAX;
  uVar2 = lua_gethookmask(L);
  p_Var5 = lua_gethook(L);
  if (p_Var5 == hookf || p_Var5 == (lua_Hook)0x0) {
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->n = -5.13828271674896e-322;
    lua_rawget(L,-10000);
  }
  else {
    lua_pushlstring(L,"external hook",0xd);
  }
  bVar7 = (uVar2 & 1) != 0;
  if (bVar7) {
    _uStack_18 = CONCAT13(99,uStack_18);
  }
  uVar6 = (ulong)bVar7;
  if ((uVar2 & 2) != 0) {
    uVar6 = (ulong)(bVar7 + 1);
    buff[bVar7] = 'r';
  }
  uVar3 = (uint)uVar6;
  if ((uVar2 & 4) != 0) {
    uVar3 = uVar3 + 1;
    buff[uVar6] = 'l';
  }
  buff[uVar3] = '\0';
  lua_pushstring(L,buff);
  iVar4 = lua_gethookcount(L);
  lua_pushinteger(L,(long)iVar4);
  return 3;
}

Assistant:

LJLIB_CF(debug_gethook)
{
  char buff[5];
  int mask = lua_gethookmask(L);
  lua_Hook hook = lua_gethook(L);
  if (hook != NULL && hook != hookf) {  /* external hook? */
    lua_pushliteral(L, "external hook");
  } else {
    (L->top++)->u64 = KEY_HOOK;
    lua_rawget(L, LUA_REGISTRYINDEX);   /* get hook */
  }
  lua_pushstring(L, unmakemask(mask, buff));
  lua_pushinteger(L, lua_gethookcount(L));
  return 3;
}